

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg.c
# Opt level: O0

int imsg_get_fd(imsgbuf *ibuf)

{
  long *__ptr;
  undefined8 *in_RDI;
  imsg_fd *ifd;
  int fd;
  int local_4;
  
  __ptr = (long *)*in_RDI;
  if (__ptr == (long *)0x0) {
    local_4 = -1;
  }
  else {
    local_4 = (int)__ptr[2];
    if (*__ptr == 0) {
      in_RDI[1] = __ptr[1];
    }
    else {
      *(long *)(*__ptr + 8) = __ptr[1];
    }
    *(long *)__ptr[1] = *__ptr;
    free(__ptr);
  }
  return local_4;
}

Assistant:

int
imsg_get_fd(struct imsgbuf *ibuf)
{
	int		 fd;
	struct imsg_fd	*ifd;

	if ((ifd = TAILQ_FIRST(&ibuf->fds)) == NULL)
		return (-1);

	fd = ifd->fd;
	TAILQ_REMOVE(&ibuf->fds, ifd, entry);
	free(ifd);

	return (fd);
}